

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.c
# Opt level: O1

void abuf_template_init_ext
               (abuf_template_storage *storage,abuf_template_data *data,size_t data_count,
               char *format)

{
  char *__s1;
  bool bVar1;
  char cVar2;
  int iVar3;
  size_t sVar4;
  abuf_template_data_entry *paVar5;
  ulong uVar6;
  bool bVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  ulong uVar11;
  abuf_template_data_entry *paVar12;
  size_t sVar13;
  abuf_template_data_entry *local_58;
  
  memset(storage,0,0x610);
  if (format == (char *)0x0) {
    storage->format = "\t";
    storage->count = 0;
    if (data_count != 0) {
      sVar4 = 0;
      do {
        if (data[sVar4].count != 0) {
          lVar8 = 0;
          uVar10 = 0;
          do {
            storage->indices[storage->count].start = 1;
            sVar13 = storage->count;
            storage->indices[sVar13].end = 0;
            storage->indices[sVar13].data =
                 (abuf_template_data_entry *)((long)&(data[sVar4].data)->key + lVar8);
            storage->count = sVar13 + 1;
            uVar10 = uVar10 + 1;
            lVar8 = lVar8 + 0x18;
          } while (uVar10 < data[sVar4].count);
        }
        sVar4 = sVar4 + 1;
      } while (sVar4 != data_count);
    }
    sVar4 = storage->count;
    if (sVar4 != 0) {
      storage->indices[0].start = 0;
      storage->indices[sVar4 - 1].end = 1;
    }
  }
  else {
    storage->format = format;
    cVar2 = *format;
    if (cVar2 != '\0') {
      bVar7 = true;
      uVar11 = 0;
      bVar9 = false;
      uVar10 = 0;
      do {
        while ((uVar6 = uVar10, cVar2 != '%' || (bVar9))) {
          bVar9 = (bool)(bVar9 ^ 1);
          if (cVar2 != '\\') {
            bVar9 = false;
          }
LAB_0010b296:
          cVar2 = format[uVar6 + 1];
          uVar10 = uVar6 + 1;
          if (cVar2 == '\0') {
            return;
          }
        }
        if (!bVar7) {
          bVar7 = true;
          if (1 < uVar6 - uVar11) {
            if (data_count == 0) {
              paVar5 = (abuf_template_data_entry *)0x0;
            }
            else {
              sVar4 = 0;
              do {
                sVar13 = data[sVar4].count;
                if (sVar13 != 0) {
                  paVar12 = data[sVar4].data;
                  do {
                    __s1 = paVar12->key;
                    iVar3 = strncmp(__s1,format + uVar11 + 1,~uVar11 + uVar6);
                    if ((iVar3 == 0) && (__s1[(uVar6 - 1) - uVar11] == '\0')) {
                      bVar1 = false;
                      local_58 = paVar12;
                    }
                    else {
                      bVar1 = true;
                    }
                    paVar5 = local_58;
                    if (!bVar1) goto LAB_0010b263;
                    paVar12 = paVar12 + 1;
                    sVar13 = sVar13 - 1;
                  } while (sVar13 != 0);
                }
                sVar4 = sVar4 + 1;
              } while (sVar4 != data_count);
              paVar5 = (abuf_template_data_entry *)0x0;
            }
LAB_0010b263:
            if (paVar5 != (abuf_template_data_entry *)0x0) {
              storage->indices[storage->count].start = uVar11;
              sVar4 = storage->count;
              storage->indices[sVar4].end = uVar6 + 1;
              storage->indices[sVar4].data = paVar5;
              storage->count = sVar4 + 1;
            }
          }
          goto LAB_0010b296;
        }
        cVar2 = format[uVar6 + 1];
        bVar7 = false;
        uVar10 = uVar6 + 1;
        uVar11 = uVar6;
        if (cVar2 == '\0') {
          return;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void
abuf_template_init_ext(
  struct abuf_template_storage *storage, struct abuf_template_data *data, size_t data_count, const char *format) {
  /* helper string for 'just one tab between keys' */
  static const char default_format[] = "\t";

  struct abuf_template_data_entry *d;
  bool no_open_format = true;
  bool escape = false;
  size_t start = 0;
  size_t pos = 0;
  size_t i, j;

  memset(storage, 0, sizeof(*storage));

  if (!format) {
    /* generate default format, just tab between each value */
    storage->format = default_format;

    storage->count = 0;

    for (j = 0; j < data_count; j++) {
      for (i = 0; i < data[j].count; i++) {
        storage->indices[storage->count].start = 1;
        storage->indices[storage->count].end = 0;
        storage->indices[storage->count].data = &data[j].data[i];
        storage->count++;
      }
    }

    if (storage->count) {
      storage->indices[0].start = 0;
      storage->indices[storage->count - 1].end = 1;
    }
    return;
  }

  storage->format = format;
  while (format[pos]) {
    if (!escape && format[pos] == '%') {
      if (no_open_format) {
        start = pos++;
        no_open_format = false;
        continue;
      }
      if (pos - start > 1) {
        d = _find_template(data, data_count, &format[start + 1], pos - start - 1);
        if (d) {
          storage->indices[storage->count].start = start;
          storage->indices[storage->count].end = pos + 1;
          storage->indices[storage->count].data = d;

          storage->count++;
        }
      }
      no_open_format = true;
    }
    else if (format[pos] == '\\') {
      /* handle "\\" and "\%" in text */
      escape = !escape;
    }
    else {
      escape = false;
    }

    pos++;
  }
}